

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlimits.c
# Opt level: O0

void channel(void *ctx,char *msg,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined4 local_38;
  int res;
  va_list args;
  char *msg_local;
  void *ctx_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  if (testErrorsSize < 0x8000) {
    args[0].overflow_arg_area = local_f8;
    args[0]._0_8_ = &stack0x00000008;
    res = 0x30;
    local_38 = 0x10;
    local_e8 = in_RDX;
    local_e0 = in_RCX;
    local_d8 = in_R8;
    local_d0 = in_R9;
    iVar1 = vsnprintf(testErrors + testErrorsSize,(long)(0x8000 - testErrorsSize),msg,&local_38);
    if (testErrorsSize + iVar1 < 0x8000) {
      testErrorsSize = iVar1 + testErrorsSize;
    }
    else {
      testErrorsSize = 0x8000;
      testErrors[0x8000] = '\0';
    }
    testErrors[testErrorsSize] = '\0';
  }
  return;
}

Assistant:

static void XMLCDECL
channel(void *ctx  ATTRIBUTE_UNUSED, const char *msg, ...) {
    va_list args;
    int res;

    if (testErrorsSize >= 32768)
        return;
    va_start(args, msg);
    res = vsnprintf(&testErrors[testErrorsSize],
                    32768 - testErrorsSize,
		    msg, args);
    va_end(args);
    if (testErrorsSize + res >= 32768) {
        /* buffer is full */
	testErrorsSize = 32768;
	testErrors[testErrorsSize] = 0;
    } else {
        testErrorsSize += res;
    }
    testErrors[testErrorsSize] = 0;
}